

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_(AssertionResultData *this)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff88;
  ReusableStringStream *this_00;
  string local_50 [32];
  ReusableStringStream *in_stack_ffffffffffffffd0;
  ReusableStringStream local_20 [2];
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = LazyExpression::operator_cast_to_bool((LazyExpression *)(in_RSI + 0x40)), bVar1)) {
    this_00 = local_20;
    ReusableStringStream::ReusableStringStream(this_00);
    ReusableStringStream::operator<<(this_00,(LazyExpression *)in_stack_ffffffffffffff88);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff88);
    std::__cxx11::string::operator=((string *)(in_RSI + 0x20),local_50);
    std::__cxx11::string::~string(local_50);
    ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffd0);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x20));
  return in_RDI;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }